

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::evalTexture2DProj(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  Texture2D *pTVar2;
  int i_1;
  int i;
  long lVar3;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  float local_48 [4];
  undefined8 local_38;
  undefined8 uStack_30;
  float local_28 [4];
  
  fVar1 = c->in[0].m_data[3];
  pTVar2 = c->textures[0].tex2D;
  lVar3 = 0;
  tcu::sampleLevelArray2D
            ((ConstPixelBufferAccess *)local_28,(int)(pTVar2->m_view).m_levels,
             (Sampler *)(ulong)(uint)(pTVar2->m_view).m_numLevels,c->in[0].m_data[0] / fVar1,
             c->in[0].m_data[1] / fVar1,(int)c + 0x70,p->lod);
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  local_48[2] = 0.0;
  local_48[3] = 0.0;
  do {
    local_48[lVar3] = local_28[lVar3] * (p->scale).m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  local_38 = 0;
  uStack_30 = 0;
  lVar3 = 0;
  do {
    *(float *)((long)&local_38 + lVar3 * 4) = local_48[lVar3] + (p->bias).m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  *(undefined8 *)(c->color).m_data = local_38;
  *(undefined8 *)((c->color).m_data + 2) = uStack_30;
  return;
}

Assistant:

static void		evalTexture2DProj		(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture2D(c, c.in[0].x()/c.in[0].w(), c.in[0].y()/c.in[0].w(), p.lod)*p.scale + p.bias; }